

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

void CVmObjList::add_to_list(vm_val_t *result,vm_obj_id_t self,char *lstval,vm_val_t *rhs)

{
  int iVar1;
  vm_obj_id_t obj_00;
  vm_val_t *this;
  CVmObject *ret;
  vm_val_t *in_RCX;
  vm_obj_id_t in_ESI;
  vm_val_t *in_RDI;
  vm_val_t val;
  int i;
  CVmObjList *objptr;
  vm_obj_id_t obj;
  int alo_cnt;
  int rhs_cnt;
  int lhs_cnt;
  int iVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  vm_val_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int idx;
  int iVar4;
  
  this = CVmStack::push();
  vm_val_t::set_obj(this,in_ESI);
  CVmStack::push(in_RCX);
  vmb_get_len((char *)0x31b1bc);
  iVar1 = vm_val_t::is_listlike
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = vm_val_t::ll_length(in_stack_ffffffffffffffb8);
  }
  iVar2 = iVar1;
  if (iVar1 < 0) {
    iVar2 = 1;
  }
  iVar3 = iVar1;
  iVar4 = iVar2;
  obj_00 = create(in_stack_ffffffffffffffb4,CONCAT44(iVar1,iVar2));
  ret = vm_objp(0);
  cons_copy_elements((CVmObjList *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (size_t)in_stack_ffffffffffffffb8,
                     (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (iVar1 < 0) {
    cons_set_element((CVmObjList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     CONCAT44(iVar3,iVar2),(vm_val_t *)0x31b263);
  }
  else {
    cons_clear((CVmObjList *)CONCAT44(iVar4,obj_00),(size_t)ret,
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    for (idx = 1; idx <= iVar1; idx = idx + 1) {
      vm_val_t::ll_index((vm_val_t *)CONCAT44(iVar4,obj_00),(vm_val_t *)ret,idx);
      cons_set_element((CVmObjList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       CONCAT44(iVar3,iVar2),(vm_val_t *)0x31b2c4);
    }
  }
  vm_val_t::set_obj(in_RDI,obj_00);
  CVmStack::discard(2);
  return;
}

Assistant:

void CVmObjList::add_to_list(VMG_ vm_val_t *result,
                             vm_obj_id_t self, const char *lstval,
                             const vm_val_t *rhs)
{
    int lhs_cnt, rhs_cnt, alo_cnt;
    vm_obj_id_t obj;
    CVmObjList *objptr;

    /* push self and the other list for protection against GC */
    G_stk->push()->set_obj(self);
    G_stk->push(rhs);

    /* get the number of elements in the left-hand ('self') side */
    lhs_cnt = vmb_get_len(lstval);

    /* get the number of elements the right-hand side concatenates */
    rhs_cnt = (rhs->is_listlike(vmg0_) ? rhs->ll_length(vmg0_) : -1);

    /* if it's not a list, allocate on element */
    alo_cnt = (rhs_cnt < 0 ? 1 : rhs_cnt);

    /* allocate a new object to hold the new list */
    obj = create(vmg_ FALSE, lhs_cnt + alo_cnt);
    objptr = (CVmObjList *)vm_objp(vmg_ obj);

    /* copy the first list into the new object's list buffer */
    objptr->cons_copy_elements(0, lstval);

    /* add the value or its contents */
    if (rhs_cnt < 0)
    {
        /* single value - add it as-is */
        objptr->cons_set_element(lhs_cnt, rhs);
    }
    else
    {
        /* 
         *   clear the rest of the list, in case gc runs while retrieving
         *   elements from the rhs 
         */
        objptr->cons_clear(lhs_cnt, lhs_cnt + alo_cnt - 1);

        /* add each element from the right-hand side */
        for (int i = 1 ; i <= rhs_cnt ; ++i)
        {
            /* retrieve this element of the rhs */
            vm_val_t val;
            rhs->ll_index(vmg_ &val, i);
                
            /* store the element in the new list */
            objptr->cons_set_element(lhs_cnt + i - 1, &val);
        }
    }

    /* set the result to the new list */
    result->set_obj(obj);

    /* discard the GC protection items */
    G_stk->discard(2);
}